

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_size.c
# Opt level: O0

int pull_by_size(char *input_file,int min,int max,int length,int convert,int just_count)

{
  uint is_fasta_00;
  int iVar1;
  gzFile fd;
  kseq_t *seq_00;
  kseq_t *seq;
  uint local_40;
  int is_fasta;
  int excluded;
  int hit;
  int l;
  int count;
  gzFile fp;
  int just_count_local;
  int convert_local;
  int length_local;
  int max_local;
  int min_local;
  char *input_file_local;
  
  hit = 0;
  local_40 = 0;
  fd = (gzFile)gzopen(input_file,"r");
  if (fd == (gzFile)0x0) {
    fprintf(_stderr,"%s - Couldn\'t open fasta file %s\n",progname,input_file);
    exit(1);
  }
  seq_00 = kseq_init(fd);
  kseq_read(seq_00);
  is_fasta_00 = (uint)((seq_00->qual).s == (char *)0x0);
  gzrewind(fd);
  seq_00->f->end = 0;
  seq_00->f->begin = 0;
  seq_00->f->is_eof = 0;
  seq_00->last_char = 0;
  if (verbose_flag != 0) {
    if (is_fasta_00 == 0) {
      fprintf(_stderr,"Input is FASTQ format\n");
    }
    else {
      fprintf(_stderr,"Input is FASTA format\n");
    }
  }
  while (iVar1 = kseq_read(seq_00), -1 < iVar1) {
    iVar1 = size_filter(seq_00,is_fasta_00,min,max,length,convert,just_count);
    if (iVar1 == 0) {
      local_40 = local_40 + 1;
    }
    else {
      hit = hit + 1;
    }
  }
  kseq_destroy(seq_00);
  gzclose(fd);
  if (just_count != 0) {
    fprintf(_stdout,"Total output: %i\n",(ulong)(uint)hit);
    fprintf(_stdout,"Total excluded: %i\n",(ulong)local_40);
  }
  return hit;
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_size(char *input_file, int min, int max,int length, int convert, int just_count) {
	gzFile fp;
	int count=0,l;
	int hit = 0;
	int excluded = 0;
	int is_fasta = 0; /* assume fastq */
	kseq_t *seq;

	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp);

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); 
	kseq_rewind(seq); /* rewind to beginning for main loop */

    if (verbose_flag) {
        if (is_fasta)
            fprintf(stderr, "Input is FASTA format\n");
        else
            fprintf(stderr, "Input is FASTQ format\n");
    }

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		hit = size_filter(seq, is_fasta, min, max, length, convert, just_count);
		if (hit)
			count++;
		else
			excluded++;
	}
	kseq_destroy(seq);
	gzclose(fp); /* done reading file */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		fprintf(stdout, "Total excluded: %i\n", excluded);
	}
	return count;
}